

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::callLoggingExit
          (CLIntercept *this,char *functionName,cl_int errorCode,cl_event *event,
          cl_sync_point_khr *syncPoint,char *formatStr,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_XMM0_Qa;
  double __x;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string str;
  va_list args;
  string local_168;
  string local_148;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  std::mutex::lock(&this->m_Mutex);
  local_118 = local_e8;
  local_120 = &stack0x00000008;
  local_128 = 0x3000000030;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  getCallLoggingPrefix(this,&local_168);
  std::__cxx11::string::append((char *)&local_168);
  if (event != (cl_event *)0x0) {
    snprintf(this->m_StringBuffer,0x4000," created event = %p",*event);
    std::__cxx11::string::append((char *)&local_168);
  }
  if (syncPoint != (cl_sync_point_khr *)0x0) {
    snprintf(this->m_StringBuffer,0x4000," is sync point = %u",(ulong)*syncPoint);
    std::__cxx11::string::append((char *)&local_168);
  }
  uVar1 = vsnprintf(this->m_StringBuffer,0x4000,formatStr,&local_128);
  if (uVar1 < 0x4000) {
    std::__cxx11::string::append((char *)&local_168);
  }
  std::__cxx11::string::append((char *)&local_168);
  std::__cxx11::string::append((char *)&local_168);
  CEnumNameMap::name_abi_cxx11_(&local_148,&this->m_EnumNameMap,errorCode);
  std::__cxx11::string::append((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::operator+(&local_108,"<<<< ",&local_168);
  std::operator+(&local_148,&local_108,"\n");
  log(this,__x);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_168);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::callLoggingExit(
    const char* functionName,
    const cl_int errorCode,
    const cl_event* event,
    const cl_sync_point_khr* syncPoint,
    const char* formatStr,
    ... )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    va_list args;
    va_start( args, formatStr );

    std::string str;
    getCallLoggingPrefix( str );

    str += functionName;

    if( event )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " created event = %p", *event );
        str += m_StringBuffer;
    }
    if( syncPoint )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " is sync point = %u", *syncPoint );
        str += m_StringBuffer;
    }

    int size = CLI_VSPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, formatStr, args );
    if( size >= 0 && size < CLI_STRING_BUFFER_SIZE )
    {
        str += ": ";
        str += m_StringBuffer;
    }
    else
    {
        str += ": too long";
    }

    str += " -> ";
    str += m_EnumNameMap.name( errorCode );

    log( "<<<< " + str + "\n" );

    va_end( args );
}